

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error Mac_Read_sfnt_Resource
                   (FT_Library library,FT_Stream stream,FT_Long *offsets,FT_Long resource_cnt,
                   FT_Long face_index,FT_Face *aface)

{
  FT_ULong pos;
  FT_UInt32 FVar1;
  ulong count;
  char *driver_name;
  bool bVar2;
  FT_Long face_index_in_resource;
  int is_cff;
  FT_ULong rlen;
  FT_ULong flag_offset;
  int *piStack_50;
  FT_Error error;
  FT_Byte *sfnt_data;
  FT_Memory memory;
  FT_Face *aface_local;
  FT_Long face_index_local;
  FT_Long resource_cnt_local;
  FT_Long *offsets_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  sfnt_data = (FT_Byte *)library->memory;
  piStack_50 = (int *)0x0;
  aface_local = (FT_Face *)face_index;
  if (face_index < 0) {
    aface_local = (FT_Face *)(-1 - face_index);
  }
  if (resource_cnt <= (long)aface_local) {
    return 1;
  }
  pos = offsets[(long)aface_local];
  memory = (FT_Memory)aface;
  face_index_local = resource_cnt;
  resource_cnt_local = (FT_Long)offsets;
  offsets_local = (FT_Long *)stream;
  stream_local = (FT_Stream)library;
  flag_offset._4_4_ = FT_Stream_Seek(stream,pos);
  if (flag_offset._4_4_ == 0) {
    FVar1 = FT_Stream_ReadULong((FT_Stream)offsets_local,(FT_Error *)((long)&flag_offset + 4));
    count = (ulong)FVar1;
    if (flag_offset._4_4_ == 0) {
      if (count == 0) {
        return 1;
      }
      if (0xffffff < count) {
        return 9;
      }
      flag_offset._4_4_ =
           open_face_PS_from_sfnt_stream
                     ((FT_Library)stream_local,(FT_Stream)offsets_local,(FT_Long)aface_local,0,
                      (FT_Parameter *)0x0,(FT_Face *)memory);
      if (flag_offset._4_4_ == 0) {
        flag_offset._4_4_ = 0;
      }
      else {
        flag_offset._4_4_ = FT_Stream_Seek((FT_Stream)offsets_local,pos + 4);
        if (flag_offset._4_4_ == 0) {
          piStack_50 = (int *)ft_mem_qalloc((FT_Memory)sfnt_data,count,
                                            (FT_Error *)((long)&flag_offset + 4));
          if (flag_offset._4_4_ != 0) {
            return flag_offset._4_4_;
          }
          flag_offset._4_4_ = FT_Stream_Read((FT_Stream)offsets_local,(FT_Byte *)piStack_50,count);
          if (flag_offset._4_4_ == 0) {
            bVar2 = false;
            if (4 < count) {
              bVar2 = *piStack_50 == 0x4f54544f;
            }
            driver_name = "truetype";
            if (bVar2) {
              driver_name = "cff";
            }
            flag_offset._4_4_ =
                 open_face_from_buffer
                           ((FT_Library)stream_local,(FT_Byte *)piStack_50,count,0,driver_name,
                            (FT_Face *)memory);
          }
          else {
            ft_mem_free((FT_Memory)sfnt_data,piStack_50);
          }
        }
      }
    }
  }
  return flag_offset._4_4_;
}

Assistant:

static FT_Error
  Mac_Read_sfnt_Resource( FT_Library  library,
                          FT_Stream   stream,
                          FT_Long    *offsets,
                          FT_Long     resource_cnt,
                          FT_Long     face_index,
                          FT_Face    *aface )
  {
    FT_Memory  memory = library->memory;
    FT_Byte*   sfnt_data = NULL;
    FT_Error   error;
    FT_ULong   flag_offset;
    FT_ULong   rlen;
    int        is_cff;
    FT_Long    face_index_in_resource = 0;


    if ( face_index < 0 )
      face_index = -face_index - 1;
    if ( face_index >= resource_cnt )
      return FT_THROW( Cannot_Open_Resource );

    flag_offset = (FT_ULong)offsets[face_index];
    error = FT_Stream_Seek( stream, flag_offset );
    if ( error )
      goto Exit;

    if ( FT_READ_ULONG( rlen ) )
      goto Exit;
    if ( !rlen )
      return FT_THROW( Cannot_Open_Resource );
    if ( rlen > FT_MAC_RFORK_MAX_LEN )
      return FT_THROW( Invalid_Offset );

    error = open_face_PS_from_sfnt_stream( library,
                                           stream,
                                           face_index,
                                           0, NULL,
                                           aface );
    if ( !error )
      goto Exit;

    /* rewind sfnt stream before open_face_PS_from_sfnt_stream() */
    error = FT_Stream_Seek( stream, flag_offset + 4 );
    if ( error )
      goto Exit;

    if ( FT_QALLOC( sfnt_data, rlen ) )
      return error;
    error = FT_Stream_Read( stream, (FT_Byte *)sfnt_data, rlen );
    if ( error )
    {
      FT_FREE( sfnt_data );
      goto Exit;
    }

    is_cff = rlen > 4 && !ft_memcmp( sfnt_data, "OTTO", 4 );
    error = open_face_from_buffer( library,
                                   sfnt_data,
                                   rlen,
                                   face_index_in_resource,
                                   is_cff ? "cff" : "truetype",
                                   aface );

  Exit:
    return error;
  }